

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::greaterThan(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  
  requireDStackDepth(this,2,">");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::setTop(this_00,(&this->False)[(int)uVar1 < (int)uVar2]);
  return;
}

Assistant:

void greaterThan() {
			REQUIRE_DSTACK_DEPTH(2, ">");
			auto n2 = static_cast<SCell>(dStack.getTop()); pop();
			dStack.setTop(static_cast<SCell>(dStack.getTop()) > n2 ? True : False);
		}